

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O0

Gradient * load_gradient(Gradient *__return_storage_ptr__,string *filename)

{
  byte bVar1;
  bool bVar2;
  runtime_error *this;
  istream *piVar3;
  const_reference pvVar4;
  reference pGVar5;
  iterator __first;
  iterator __last;
  float fVar6;
  string_type local_3e0;
  string_type local_3c0;
  string_type local_3a0;
  value_type local_380;
  string_type local_370;
  string_type local_350;
  string_type local_330;
  float local_310;
  float fStack_30c;
  undefined8 local_308;
  __normal_iterator<GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
  local_300;
  GradientColor *local_2f8;
  __normal_iterator<GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
  local_2f0;
  __normal_iterator<GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
  local_2e8;
  __normal_iterator<GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
  col;
  float local_2bc;
  undefined1 local_2b8 [4];
  float pos;
  smatch m;
  regex re;
  string line;
  ifstream in;
  value_type local_4c [2];
  value_type local_2c;
  byte local_19;
  string *local_18;
  string *filename_local;
  Gradient *gradient;
  
  local_19 = 0;
  local_18 = filename;
  filename_local = (string *)__return_storage_ptr__;
  Gradient::Gradient(__return_storage_ptr__);
  local_2c.pos = 0.0;
  local_2c.r = 0.0;
  local_2c.g = 0.0;
  local_2c.b = 0.0;
  std::vector<GradientColor,_std::allocator<GradientColor>_>::push_back
            (&__return_storage_ptr__->colors,&local_2c);
  local_4c[0].pos = 1.0;
  local_4c[0].r = 1.0;
  local_4c[0].g = 1.0;
  local_4c[0].b = 1.0;
  std::vector<GradientColor,_std::allocator<GradientColor>_>::push_back
            (&__return_storage_ptr__->colors,local_4c);
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),(string *)local_18,_S_in);
  std::__cxx11::string::string
            ((string *)
             &re._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&m._M_begin,
               "([0-9]*\\.?[0-9]+):\\s*([0-9]*\\.?[0-9]+),\\s*([0-9]*\\.?[0-9]+),\\s*([0-9]*\\.?[0-9]+)$"
               ,0x10);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_2b8);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),
                          (string *)
                          &re._M_automaton.
                           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      bVar2 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &re._M_automaton.
                          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_2b8,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&m._M_begin,0);
      if (bVar2) {
        pvVar4 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)local_2b8,1);
        std::__cxx11::sub_match::operator_cast_to_string((string_type *)&col,(sub_match *)pvVar4);
        fVar6 = std::__cxx11::stof((string *)&col,(size_t *)0x0);
        std::__cxx11::string::~string((string *)&col);
        local_2bc = fVar6;
        local_2f0._M_current =
             (GradientColor *)
             std::vector<GradientColor,_std::allocator<GradientColor>_>::begin
                       (&__return_storage_ptr__->colors);
        local_2f8 = (GradientColor *)
                    std::vector<GradientColor,_std::allocator<GradientColor>_>::end
                              (&__return_storage_ptr__->colors);
        local_2e8 = std::
                    find<__gnu_cxx::__normal_iterator<GradientColor*,std::vector<GradientColor,std::allocator<GradientColor>>>,float>
                              (local_2f0,
                               (__normal_iterator<GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
                                )local_2f8,&local_2bc);
        local_300._M_current =
             (GradientColor *)
             std::vector<GradientColor,_std::allocator<GradientColor>_>::end
                       (&__return_storage_ptr__->colors);
        bVar2 = __gnu_cxx::
                operator==<GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
                          (&local_2e8,&local_300);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          local_380.pos = local_2bc;
          pvVar4 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_2b8,2);
          std::__cxx11::sub_match::operator_cast_to_string(&local_3a0,(sub_match *)pvVar4);
          local_380.r = std::__cxx11::stof(&local_3a0,(size_t *)0x0);
          pvVar4 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_2b8,3);
          std::__cxx11::sub_match::operator_cast_to_string(&local_3c0,(sub_match *)pvVar4);
          local_380.g = std::__cxx11::stof(&local_3c0,(size_t *)0x0);
          pvVar4 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_2b8,4);
          std::__cxx11::sub_match::operator_cast_to_string(&local_3e0,(sub_match *)pvVar4);
          local_380.b = std::__cxx11::stof(&local_3e0,(size_t *)0x0);
          std::vector<GradientColor,_std::allocator<GradientColor>_>::push_back
                    (&__return_storage_ptr__->colors,&local_380);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3a0);
        }
        else {
          local_310 = local_2bc;
          pvVar4 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_2b8,2);
          std::__cxx11::sub_match::operator_cast_to_string(&local_330,(sub_match *)pvVar4);
          fStack_30c = std::__cxx11::stof(&local_330,(size_t *)0x0);
          pvVar4 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_2b8,3);
          std::__cxx11::sub_match::operator_cast_to_string(&local_350,(sub_match *)pvVar4);
          fVar6 = std::__cxx11::stof(&local_350,(size_t *)0x0);
          local_308._0_4_ = fVar6;
          pvVar4 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_2b8,4);
          std::__cxx11::sub_match::operator_cast_to_string(&local_370,(sub_match *)pvVar4);
          fVar6 = std::__cxx11::stof(&local_370,(size_t *)0x0);
          local_308._4_4_ = fVar6;
          pGVar5 = __gnu_cxx::
                   __normal_iterator<GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
                   ::operator*(&local_2e8);
          pGVar5->pos = local_310;
          pGVar5->r = fStack_30c;
          pGVar5->g = (float)local_308;
          pGVar5->b = local_308._4_4_;
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_330);
        }
      }
    }
    __first = std::vector<GradientColor,_std::allocator<GradientColor>_>::begin
                        (&__return_storage_ptr__->colors);
    __last = std::vector<GradientColor,_std::allocator<GradientColor>_>::end
                       (&__return_storage_ptr__->colors);
    std::
    sort<__gnu_cxx::__normal_iterator<GradientColor*,std::vector<GradientColor,std::allocator<GradientColor>>>>
              ((__normal_iterator<GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
                )__first._M_current,
               (__normal_iterator<GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
                )__last._M_current);
    local_19 = 1;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_2b8);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&m._M_begin);
    std::__cxx11::string::~string
              ((string *)
               &re._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
    if ((local_19 & 1) == 0) {
      Gradient::~Gradient(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"unable to open gradient file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Gradient load_gradient(const std::string& filename)
{
    Gradient gradient;
    gradient.colors.push_back(GradientColor{0.0f, 0.0f, 0.0f, 0.0f});
    gradient.colors.push_back(GradientColor{1.0f, 1.0f, 1.0f, 1.0f});

    std::ifstream in{filename};
    std::string line;

    if (!in.is_open())
        throw std::runtime_error("unable to open gradient file");

    const std::regex re{R"(([0-9]*\.?[0-9]+):\s*([0-9]*\.?[0-9]+),\s*([0-9]*\.?[0-9]+),\s*([0-9]*\.?[0-9]+)$)"};
    std::smatch m;

    while (std::getline(in, line)) {
        if (std::regex_match(line, m, re)) {
            float pos = std::stof(m[1]);
            auto col = std::find(gradient.colors.begin(), gradient.colors.end(), pos);

            if (col != gradient.colors.end())
                *col = GradientColor{pos, std::stof(m[2]), std::stof(m[3]), std::stof(m[4])};
            else
                gradient.colors.push_back({pos, std::stof(m[2]), std::stof(m[3]), std::stof(m[4])});
        }
    }

    std::sort(gradient.colors.begin(), gradient.colors.end());
    return gradient;
}